

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O3

bool __thiscall ON_Thickening::operator==(ON_Thickening *this,ON_Thickening *t)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  
  bVar1 = On(this);
  bVar2 = On(t);
  if (bVar1 == bVar2) {
    dVar3 = Distance(this);
    dVar4 = Distance(t);
    if ((dVar3 == dVar4) && (!NAN(dVar3) && !NAN(dVar4))) {
      bVar1 = Solid(this);
      bVar2 = Solid(t);
      if (bVar1 == bVar2) {
        bVar1 = OffsetOnly(this);
        bVar2 = OffsetOnly(t);
        if (bVar1 == bVar2) {
          bVar1 = BothSides(this);
          bVar2 = BothSides(t);
          return bVar2 == bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Thickening::operator == (const ON_Thickening& t) const
{
  if (On()         != t.On())         return false;
  if (Distance()   != t.Distance())   return false;
  if (Solid()      != t.Solid())      return false;
  if (OffsetOnly() != t.OffsetOnly()) return false;
  if (BothSides()  != t.BothSides())  return false;

  return true;
}